

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorFederate.cpp
# Opt level: O2

void __thiscall
helics::TranslatorFederate::handleMessage(TranslatorFederate *this,ActionMessage *command)

{
  TimeCoordinator *timeCoord;
  ushort uVar1;
  action_t aVar2;
  element_type *peVar3;
  GlobalHandle gid;
  GlobalHandle targetId;
  GlobalHandle gid_00;
  GlobalHandle subscriberToRemove;
  GlobalHandle gid_01;
  GlobalHandle sourceToRemove;
  GlobalHandle newSubscriber;
  byte *pbVar4;
  GlobalHandle dest;
  size_t sVar5;
  pointer pcVar6;
  GlobalHandle newSource;
  size_type sVar7;
  string_view sunits;
  FederateStates FVar8;
  bool bVar9;
  TranslatorInfo *pTVar10;
  char *__s;
  AirLock<std::any,_std::mutex,_std::condition_variable> *this_00;
  string *psVar11;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  string_view subscriberName;
  string_view sourceName;
  string_view sourceName_00;
  string_view destName;
  basic_string_view<char,_std::char_traits<char>_> __args_2;
  string_view sourceType;
  string_view stype;
  string_view destType;
  tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> proc_result;
  shared_ptr<helics::TranslatorOperator> operation;
  string local_108;
  ActionMessage disconnect;
  
  timeCoord = &this->mCoord;
  processCoordinatorMessage
            ((helics *)&proc_result,command,timeCoord,this->current_state,false,
             (GlobalFederateId)(this->mFedID).gid);
  FVar8 = this->current_state;
  if ((FVar8 == EXECUTING &
      (byte)proc_result.
            super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>.
            super__Tuple_impl<1UL,_helics::MessageProcessingResult,_bool>.
            super__Tuple_impl<2UL,_bool>.super__Head_base<2UL,_bool,_false>._M_head_impl) == 1) {
    BaseTimeCoordinator::disconnect(&timeCoord->super_BaseTimeCoordinator);
    ActionMessage::ActionMessage(&disconnect,cmd_disconnect);
    disconnect.source_id.gid = (this->mFedID).gid;
    disconnect.dest_id.gid = 0;
    std::function<void_(const_helics::ActionMessage_&)>::operator()
              (&this->mQueueMessage,&disconnect);
    ActionMessage::~ActionMessage(&disconnect);
    FVar8 = this->current_state;
  }
  if (FVar8 != proc_result.
               super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>
               .super__Head_base<0UL,_helics::FederateStates,_false>._M_head_impl) {
    this->current_state =
         proc_result.
         super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>.
         super__Head_base<0UL,_helics::FederateStates,_false>._M_head_impl;
    if (proc_result.
        super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>.
        super__Head_base<0UL,_helics::FederateStates,_false>._M_head_impl == ERRORED) {
      disconnect._0_8_ = &disconnect.dest_id;
      disconnect.source_id.gid = 0;
      disconnect.source_handle.hid = 0;
      disconnect.dest_id.gid = disconnect.dest_id.gid & 0xffffff00;
      peVar3 = (element_type *)(command->payload).bufferSize;
      if (peVar3 == (element_type *)0x0) {
        __s = commandErrorString(0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&disconnect,
                   __s);
        bVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&disconnect,"unknown");
        if (bVar9) {
          std::__cxx11::to_string(&local_108,command->messageID);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &operation," code:",&local_108);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &disconnect,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&operation
                    );
          std::__cxx11::string::~string((string *)&operation);
          std::__cxx11::string::~string((string *)&local_108);
        }
      }
      else {
        operation.super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(command->payload).heap;
        operation.super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = peVar3;
        std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                  ((string *)&disconnect,
                   (basic_string_view<char,_std::char_traits<char>_> *)&operation);
      }
      if ((this->mLogger).super__Function_base._M_manager != (_Manager_type)0x0) {
        __args_1._M_str = (this->mName)._M_dataplus._M_p;
        __args_1._M_len = (this->mName)._M_string_length;
        __args_2._M_str = (char *)disconnect._0_8_;
        __args_2._M_len._0_4_ = disconnect.source_id.gid;
        __args_2._M_len._4_4_ = disconnect.source_handle.hid;
        std::
        function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::operator()(&this->mLogger,0,__args_1,__args_2);
      }
      std::__cxx11::string::~string((string *)&disconnect);
    }
    else if (proc_result.
             super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>.
             super__Head_base<0UL,_helics::FederateStates,_false>._M_head_impl == EXECUTING) {
      TimeCoordinator::timeRequest
                (timeCoord,(Time)0x7fffffffffffffff,NO_ITERATIONS,(Time)0x7fffffffffffffff,
                 (Time)0x7fffffffffffffff);
    }
    else if (proc_result.
             super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>.
             super__Head_base<0UL,_helics::FederateStates,_false>._M_head_impl == INITIALIZING) {
      TimeCoordinator::enteringExecMode(timeCoord,NO_ITERATIONS);
      ActionMessage::ActionMessage(&disconnect,cmd_exec_check);
      disconnect.dest_id.gid = (this->mFedID).gid;
      disconnect.source_id.gid = disconnect.dest_id.gid;
      handleMessage(this,&disconnect);
      ActionMessage::~ActionMessage(&disconnect);
    }
  }
  if (proc_result.
      super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>.
      super__Tuple_impl<1UL,_helics::MessageProcessingResult,_bool>.
      super__Head_base<1UL,_helics::MessageProcessingResult,_false>._M_head_impl !=
      CONTINUE_PROCESSING) {
    if (proc_result.
        super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>.
        super__Tuple_impl<1UL,_helics::MessageProcessingResult,_bool>.
        super__Head_base<1UL,_helics::MessageProcessingResult,_false>._M_head_impl !=
        REPROCESS_MESSAGE) {
      return;
    }
    if ((command->dest_id).gid == (this->mFedID).gid) {
      handleMessage(this,command);
      return;
    }
    std::function<void_(const_helics::ActionMessage_&)>::operator()(&this->mSendMessage,command);
    return;
  }
  aVar2 = command->messageAction;
  switch(aVar2) {
  case cmd_close_interface:
    disconnect.messageAction = (command->source_id).gid;
    disconnect.messageID = (command->source_handle).hid;
    gmlc::containers::MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle>::find
              (&this->translators,(GlobalHandle *)&disconnect);
    break;
  case cmd_remove_subscriber:
    gid_00.fed_id.gid = (command->dest_id).gid;
    gid_00.handle.hid = (command->dest_handle).hid;
    pTVar10 = getTranslatorInfo(this,gid_00);
    if (pTVar10 != (TranslatorInfo *)0x0) {
      subscriberToRemove.fed_id.gid = (command->source_id).gid;
      subscriberToRemove.handle.hid = (command->source_handle).hid;
      PublicationInfo::removeSubscriber(&pTVar10->pub,subscriberToRemove);
    }
    break;
  case cmd_remove_filter:
    break;
  case cmd_remove_publication:
    gid_01.fed_id.gid = (command->dest_id).gid;
    gid_01.handle.hid = (command->dest_handle).hid;
    pTVar10 = getTranslatorInfo(this,gid_01);
    if (pTVar10 != (TranslatorInfo *)0x0) {
      sourceToRemove.fed_id.gid = (command->source_id).gid;
      sourceToRemove.handle.hid = (command->source_handle).hid;
      InputInfo::removeSource(&pTVar10->ipt,sourceToRemove,(Time)0x0);
    }
    break;
  case cmd_remove_endpoint:
    gid.fed_id.gid = (command->dest_id).gid;
    gid.handle.hid = (command->dest_handle).hid;
    pTVar10 = getTranslatorInfo(this,gid);
    if (pTVar10 != (TranslatorInfo *)0x0) {
      targetId.fed_id.gid = (command->source_id).gid;
      targetId.handle.hid = (command->source_handle).hid;
      EndpointInfo::removeTarget(&pTVar10->ept,targetId);
    }
    break;
  default:
    if (aVar2 == cmd_add_publisher) {
      pTVar10 = getTranslatorInfo(this,(GlobalFederateId)(this->mFedID).gid,
                                  (InterfaceHandle)(command->dest_handle).hid);
      if (pTVar10 == (TranslatorInfo *)0x0) {
        return;
      }
      pbVar4 = (command->payload).heap;
      newSource.fed_id.gid = (command->source_id).gid;
      newSource.handle.hid = (command->source_handle).hid;
      sVar5 = (command->payload).bufferSize;
      psVar11 = ActionMessage::getString_abi_cxx11_(command,0);
      pcVar6 = (psVar11->_M_dataplus)._M_p;
      sVar7 = psVar11->_M_string_length;
      psVar11 = ActionMessage::getString_abi_cxx11_(command,1);
      sunits._M_str = (psVar11->_M_dataplus)._M_p;
      sunits._M_len = psVar11->_M_string_length;
      sourceName_00._M_str = (char *)pbVar4;
      sourceName_00._M_len = sVar5;
      stype._M_str = pcVar6;
      stype._M_len = sVar7;
      InputInfo::addSource(&pTVar10->ipt,newSource,sourceName_00,stype,sunits);
LAB_002fe848:
      if ((command->flags & 0x10) != 0) {
        return;
      }
      TimeCoordinator::addDependency(timeCoord,(GlobalFederateId)(command->source_id).gid);
      return;
    }
    if (aVar2 == cmd_pub) {
LAB_002fe467:
      pTVar10 = getTranslatorInfo(this,(GlobalFederateId)(this->mFedID).gid,
                                  (InterfaceHandle)(command->dest_handle).hid);
      if (pTVar10 != (TranslatorInfo *)0x0) {
        executeTranslator(this,command,pTVar10);
      }
    }
    else {
      if (aVar2 == cmd_add_subscriber) {
        pTVar10 = getTranslatorInfo(this,(GlobalFederateId)(this->mFedID).gid,
                                    (InterfaceHandle)(command->dest_handle).hid);
        if (pTVar10 == (TranslatorInfo *)0x0) {
          return;
        }
        newSubscriber.fed_id.gid = (command->source_id).gid;
        newSubscriber.handle.hid = (command->source_handle).hid;
        subscriberName._M_str = (char *)(command->payload).heap;
        subscriberName._M_len = (command->payload).bufferSize;
        PublicationInfo::addSubscriber(&pTVar10->pub,newSubscriber,subscriberName);
      }
      else {
        if (aVar2 != cmd_add_endpoint) {
          if (aVar2 == cmd_core_configure) {
            if (command->messageID != 0x23e) {
              return;
            }
            pTVar10 = getTranslatorInfo(this,(GlobalFederateId)(this->mFedID).gid,
                                        (InterfaceHandle)(command->source_handle).hid);
            if (pTVar10 == (TranslatorInfo *)0x0) {
              return;
            }
            this_00 = std::
                      function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>
                      ::operator()(&this->mGetAirLock,(uint)command->counter);
            gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>::try_unload
                      ((optional<std::any> *)&disconnect,this_00);
            if ((char)disconnect.dest_id.gid == '\x01') {
              std::any_cast<std::shared_ptr<helics::TranslatorOperator>>((any *)&operation);
              std::__shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>::operator=
                        (&(pTVar10->tranOp).
                          super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>
                         ,&operation.
                           super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>
                        );
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&operation.
                          super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
            }
            std::_Optional_payload_base<std::any>::_M_reset
                      ((_Optional_payload_base<std::any> *)&disconnect);
            return;
          }
          if (aVar2 != cmd_send_message) {
            return;
          }
          goto LAB_002fe467;
        }
        pTVar10 = getTranslatorInfo(this,(GlobalFederateId)(this->mFedID).gid,
                                    (InterfaceHandle)(command->dest_handle).hid);
        if (pTVar10 == (TranslatorInfo *)0x0) {
          return;
        }
        uVar1 = command->flags;
        pbVar4 = (command->payload).heap;
        dest.fed_id.gid = (command->source_id).gid;
        dest.handle.hid = (command->source_handle).hid;
        sVar5 = (command->payload).bufferSize;
        psVar11 = ActionMessage::getString_abi_cxx11_(command,0);
        pcVar6 = (psVar11->_M_dataplus)._M_p;
        if ((uVar1 & 2) == 0) {
          sourceName._M_str = (char *)pbVar4;
          sourceName._M_len = sVar5;
          sourceType._M_str = pcVar6;
          sourceType._M_len = psVar11->_M_string_length;
          EndpointInfo::addSource(&pTVar10->ept,dest,sourceName,sourceType);
          goto LAB_002fe848;
        }
        destName._M_str = (char *)pbVar4;
        destName._M_len = sVar5;
        destType._M_str = pcVar6;
        destType._M_len = psVar11->_M_string_length;
        EndpointInfo::addDestination(&pTVar10->ept,dest,destName,destType);
      }
      if ((command->flags & 0x10) == 0) {
        TimeCoordinator::addDependent(timeCoord,(GlobalFederateId)(command->source_id).gid);
      }
    }
  }
  return;
}

Assistant:

void TranslatorFederate::handleMessage(ActionMessage& command)
{
    auto proc_result = processCoordinatorMessage(command, &mCoord, current_state, false, mFedID);

    if (std::get<2>(proc_result) && current_state == FederateStates::EXECUTING) {
        mCoord.disconnect();
        ActionMessage disconnect(CMD_DISCONNECT);
        disconnect.source_id = mFedID;
        disconnect.dest_id = parent_broker_id;
        mQueueMessage(disconnect);
    }
    if (current_state != std::get<0>(proc_result)) {
        current_state = std::get<0>(proc_result);
        switch (current_state) {
            case FederateStates::INITIALIZING:
                mCoord.enteringExecMode(IterationRequest::NO_ITERATIONS);
                {
                    ActionMessage echeck{CMD_EXEC_CHECK};
                    echeck.dest_id = mFedID;
                    echeck.source_id = mFedID;
                    handleMessage(echeck);
                }
                break;
            case FederateStates::EXECUTING:
                mCoord.timeRequest(Time::maxVal(),
                                   IterationRequest::NO_ITERATIONS,
                                   Time::maxVal(),
                                   Time::maxVal());
                break;
            case FederateStates::FINISHED:
                break;
            case FederateStates::ERRORED: {
                std::string errorString;
                if (command.payload.empty()) {
                    errorString = commandErrorString(command.messageID);
                    if (errorString == "unknown") {
                        errorString += " code:" + std::to_string(command.messageID);
                    }
                } else {
                    errorString = command.payload.to_string();
                }
                if (mLogger) {
                    mLogger(HELICS_LOG_LEVEL_ERROR, mName, errorString);
                }
            } break;
            default:
                break;
        }
    }

    switch (std::get<1>(proc_result)) {
        case MessageProcessingResult::CONTINUE_PROCESSING:
            break;
        case MessageProcessingResult::REPROCESS_MESSAGE:
            if (command.dest_id != mFedID) {
                mSendMessage(command);
                return;
            }
            return handleMessage(command);
        case MessageProcessingResult::DELAY_MESSAGE:
        default:
            return;
    }
    switch (command.action()) {
        case CMD_CLOSE_INTERFACE: {
            auto* tran = translators.find(command.getSource());
            if (tran != nullptr) {
                // TODO(PT) actually close the interface
            }
        } break;

        case CMD_REMOVE_ENDPOINT: {
            auto* tranI = getTranslatorInfo(command.getDest());
            if (tranI != nullptr) {
                tranI->getEndpointInfo()->removeTarget(command.getSource());
            }
        } break;
        case CMD_REMOVE_PUBLICATION: {
            auto* tranI = getTranslatorInfo(command.getDest());
            if (tranI != nullptr) {
                tranI->getInputInfo()->removeSource(command.getSource(), timeZero);
            }

        } break;
        case CMD_REMOVE_SUBSCRIBER: {
            auto* tranI = getTranslatorInfo(command.getDest());
            if (tranI != nullptr) {
                tranI->getPubInfo()->removeSubscriber(command.getSource());
            }

        } break;
        case CMD_ADD_PUBLISHER: {
            auto* tranI = getTranslatorInfo(mFedID, command.dest_handle);
            if (tranI != nullptr) {
                tranI->getInputInfo()->addSource(command.getSource(),
                                                 command.name(),
                                                 command.getString(typeStringLoc),
                                                 command.getString(unitStringLoc));

                if (!checkActionFlag(command, error_flag)) {
                    mCoord.addDependency(command.source_id);
                }
            }
        } break;
        case CMD_ADD_SUBSCRIBER: {
            auto* tranI = getTranslatorInfo(mFedID, command.dest_handle);
            if (tranI != nullptr) {
                tranI->getPubInfo()->addSubscriber(command.getSource(), command.name());

                if (!checkActionFlag(command, error_flag)) {
                    mCoord.addDependent(command.source_id);
                }
            }
        } break;
        case CMD_ADD_ENDPOINT: {
            auto* tranI = getTranslatorInfo(mFedID, command.dest_handle);
            if (tranI != nullptr) {
                if (checkActionFlag(command, destination_target)) {
                    tranI->getEndpointInfo()->addDestination(command.getSource(),
                                                             command.name(),
                                                             command.getString(typeStringLoc));
                    if (!checkActionFlag(command, error_flag)) {
                        mCoord.addDependent(command.source_id);
                    }
                } else {
                    tranI->getEndpointInfo()->addSource(command.getSource(),
                                                        command.name(),
                                                        command.getString(typeStringLoc));
                    if (!checkActionFlag(command, error_flag)) {
                        mCoord.addDependency(command.source_id);
                    }
                }
            }

        } break;
        case CMD_CORE_CONFIGURE:
            if (command.messageID == UPDATE_TRANSLATOR_OPERATOR) {
                auto* tranI = getTranslatorInfo(mFedID, command.source_handle);
                if (tranI != nullptr) {
                    auto locker = mGetAirLock(command.counter).try_unload();
                    if (locker) {
                        auto operation =
                            std::any_cast<std::shared_ptr<TranslatorOperator>>(std::move(*locker));
                        tranI->tranOp = std::move(operation);
                    }
                }
            }
            break;
        case CMD_SEND_MESSAGE:
        case CMD_PUB: {
            auto* tranI = getTranslatorInfo(mFedID, command.dest_handle);
            if (tranI != nullptr) {
                executeTranslator(command, tranI);
            }
        } break;
        default:
            break;
    }
}